

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O3

string_view __thiscall google::protobuf::io::Printer::LookupVar(Printer *this,string_view var)

{
  pointer pfVar1;
  LogMessage *this_00;
  size_type in_R9;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view sVar2;
  string_view var_00;
  Span<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames;
  optional<google::protobuf::io::Printer::ValueImpl<false>_> result;
  LogMessage local_80;
  _Storage<google::protobuf::io::Printer::ValueImpl<false>,_false> local_70;
  char local_20;
  
  var_00._M_len = var._M_str;
  pfVar1 = (this->var_lookups_).
           super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  frames.ptr_ = (pointer)((long)(this->var_lookups_).
                                super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar1 >> 5);
  var_00._M_str = (char *)pfVar1;
  frames.len_ = in_R9;
  (anonymous_namespace)::LookupInFrameStack<google::protobuf::io::Printer::ValueImpl<false>>
            ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)&local_70._M_value,
             (_anonymous_namespace_ *)var._M_len,var_00,frames);
  if (local_20 == '\0') {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
               ,0x132,"result.has_value()");
    str._M_str = "could not find ";
    str._M_len = 0xf;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_80,str);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_80,var);
  }
  else {
    if (local_70._M_value.value.
        super__Variant_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<bool_()>_>
        .super__Move_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
        super__Copy_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
        super__Move_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
        super__Copy_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
        super__Variant_storage_alias<std::basic_string_view<char>,_std::function<bool_()>_>._M_index
        == '\0') {
      std::_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_> *)
                 &local_70._M_value);
      sVar2._M_len = local_70._0_8_;
      sVar2._M_str = (char *)local_70._8_8_;
      return sVar2;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
               ,0x135,"view != nullptr");
    str_00._M_str = "could not find ";
    str_00._M_len = 0xf;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_80,str_00);
    this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_80,var);
    str_01._M_str = "; found callback instead";
    str_01._M_len = 0x18;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str_01)
    ;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
}

Assistant:

absl::string_view Printer::LookupVar(absl::string_view var) {
  auto result = LookupInFrameStack(var, absl::MakeSpan(var_lookups_));
  ABSL_CHECK(result.has_value()) << "could not find " << var;

  auto* view = result->AsString();
  ABSL_CHECK(view != nullptr)
      << "could not find " << var << "; found callback instead";

  return *view;
}